

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int file_sort(FINFO **fpp,size_t n,_func_int_void_ptr_void_ptr *sortfn)

{
  FINFO **__base;
  FINFO **sort_bufp;
  FINFO **fp;
  _func_int_void_ptr_void_ptr *sortfn_local;
  size_t n_local;
  FINFO **fpp_local;
  
  __base = prepare_sort_buf(*fpp,n);
  if (__base == (FINFO **)0x0) {
    fpp_local._4_4_ = 0;
  }
  else {
    qsort(__base,n,8,(__compar_fn_t)sortfn);
    sort_bufp = __base;
    for (sortfn_local = (_func_int_void_ptr_void_ptr *)n;
        (_func_int_void_ptr_void_ptr *)0x1 < sortfn_local; sortfn_local = sortfn_local + -1) {
      (*sort_bufp)->next = sort_bufp[1];
      sort_bufp = sort_bufp + 1;
    }
    (*sort_bufp)->next = (finfo *)0x0;
    *fpp = *__base;
    free(__base);
    fpp_local._4_4_ = 1;
  }
  return fpp_local._4_4_;
}

Assistant:

static int file_sort(FINFO **fpp, size_t n, int (*sortfn)(const void *, const void *))
{
  FINFO **fp;
  FINFO **sort_bufp;

  if ((sort_bufp = prepare_sort_buf(*fpp, n)) == (FINFO **)NULL) return (0);

  qsort(sort_bufp, n, sizeof(FINFO *), sortfn);

  /*
   * Relink FINFO structures in a buffer.
   */
  for (fp = sort_bufp; n > 1; fp++, n--) (*fp)->next = *(fp + 1);
  (*fp)->next = (FINFO *)NULL;

  *fpp = *sort_bufp;

  free((char *)sort_bufp);

  return (1);
}